

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestSpecParser * __thiscall Catch::TestSpecParser::parse(TestSpecParser *this,string *arg)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 in_RSI;
  TestSpecParser *in_RDI;
  TestSpecParser *unaff_retaddr;
  TestSpecParser *in_stack_00000060;
  string local_30 [47];
  
  in_RDI->m_mode = None;
  in_RDI->m_exclusion = false;
  in_RDI->m_start = 0xffffffffffffffff;
  unique0x10000123 = in_RDI;
  (*in_RDI->m_tagAliases->_vptr_ITagAliasRegistry[3])(local_30,in_RDI->m_tagAliases,in_RSI);
  std::__cxx11::string::operator=((string *)&in_RDI->m_arg,local_30);
  std::__cxx11::string::~string(local_30);
  in_RDI->m_pos = 0;
  while( true ) {
    uVar1 = in_RDI->m_pos;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uVar1) break;
    std::__cxx11::string::operator[]((ulong)&in_RDI->m_arg);
    visitChar(unaff_retaddr,(char)((ulong)stack0xfffffffffffffff8 >> 0x38));
    in_RDI->m_pos = in_RDI->m_pos + 1;
  }
  if (in_RDI->m_mode == Name) {
    addPattern<Catch::TestSpec::NamePattern>(in_stack_00000060);
  }
  return in_RDI;
}

Assistant:

TestSpecParser& parse( std::string const& arg ) {
            m_mode = None;
            m_exclusion = false;
            m_start = std::string::npos;
            m_arg = m_tagAliases->expandAliases( arg );
            for( m_pos = 0; m_pos < m_arg.size(); ++m_pos )
                visitChar( m_arg[m_pos] );
            if( m_mode == Name )
                addPattern<TestSpec::NamePattern>();
            return *this;
        }